

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int jsonTranslateTextToBlob(JsonParse *pParse,u32 i)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  u32 uVar4;
  char *pcVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  size_t sVar16;
  char *pcVar17;
  u32 uVar18;
  char *pcVar19;
  long lVar20;
  char cVar21;
  u8 uVar22;
  byte *pbVar23;
  long lVar24;
  u32 uVar25;
  ulong uVar26;
  ulong uVar27;
  bool bVar28;
  
  uVar15 = (ulong)i;
  pcVar5 = pParse->zJson;
LAB_001bb148:
  do {
    pcVar17 = pcVar5 + uVar15;
    bVar7 = pcVar5[uVar15];
    uVar12 = (uint)bVar7;
    uVar13 = (uint)uVar15;
    if (0x5c < uVar12) {
      if (uVar12 < 0x7b) {
        if (bVar7 < 0x6e) {
          if (bVar7 == 0x5d) {
            pParse->iErr = uVar13;
            return -3;
          }
          if (uVar12 == 0x66) {
            iVar14 = strncmp(pcVar17,"false",5);
            if ((iVar14 != 0) || (uVar12 = uVar13 + 5, (""[(byte)pcVar5[uVar12]] & 6) != 0)) {
LAB_001bb278:
              pParse->iErr = uVar13;
              return -1;
            }
            uVar13 = pParse->nBlob;
            if (uVar13 < pParse->nBlobAlloc) {
              pParse->nBlob = uVar13 + 1;
              pParse->aBlob[uVar13] = '\x02';
              return uVar12;
            }
            uVar22 = '\x02';
            goto LAB_001bbe72;
          }
        }
        else if (bVar7 == 0x6e) {
          iVar14 = strncmp(pcVar17,"null",4);
          if ((iVar14 == 0) && (uVar12 = uVar13 + 4, (""[(byte)pcVar5[uVar12]] & 6) == 0)) {
            uVar13 = pParse->nBlob;
            if (uVar13 < pParse->nBlobAlloc) {
              pParse->nBlob = uVar13 + 1;
              pParse->aBlob[uVar13] = '\0';
              return uVar12;
            }
            uVar22 = '\0';
            goto LAB_001bbe72;
          }
        }
        else if (bVar7 == 0x74) {
          iVar14 = strncmp(pcVar17,"true",4);
          if ((iVar14 != 0) || (uVar12 = uVar13 + 4, (""[(byte)pcVar5[uVar12]] & 6) != 0))
          goto LAB_001bb278;
          uVar13 = pParse->nBlob;
          if (uVar13 < pParse->nBlobAlloc) {
            pParse->nBlob = uVar13 + 1;
            pParse->aBlob[uVar13] = '\x01';
            return uVar12;
          }
          uVar22 = '\x01';
LAB_001bbe72:
          jsonBlobExpandAndAppendOneByte(pParse,uVar22);
          return uVar12;
        }
        goto switchD_001bb171_caseD_1;
      }
      if ((uVar12 - 0xc2 < 0x2e) && ((0x200380000001U >> ((ulong)(uVar12 - 0xc2) & 0x3f) & 1) != 0))
      goto switchD_001bb171_caseD_b;
      if (uVar12 == 0x7d) {
        pParse->iErr = uVar13;
        return -2;
      }
      if (uVar12 != 0x7b) goto switchD_001bb171_caseD_1;
      uVar25 = pParse->nBlob;
      jsonBlobAppendNode(pParse,'\f',pParse->nJson - uVar13,(void *)0x0);
      uVar12 = *(int *)&pParse->iDepth + 1;
      pParse->iDepth = (u16)uVar12;
      if (1000 < (uVar12 & 0xffff)) goto LAB_001bbaf2;
      uVar4 = pParse->nBlob;
      break;
    }
    switch(bVar7) {
    case 0:
      return 0;
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x21:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x28:
    case 0x29:
    case 0x2a:
      goto switchD_001bb171_caseD_1;
    case 9:
    case 10:
    case 0xd:
    case 0x20:
      sVar16 = strspn(pcVar5 + (uVar13 + 1),"\t\n\r ");
      uVar15 = (ulong)(uVar13 + (int)sVar16 + 1);
      break;
    case 0xb:
    case 0xc:
    case 0x2f:
      goto switchD_001bb171_caseD_b;
    case 0x27:
      pParse->hasNonstd = '\x01';
    case 0x22:
      cVar21 = *pcVar17;
      uVar22 = '\a';
      uVar12 = uVar13 + 1;
      goto LAB_001bb884;
    case 0x2b:
      pParse->hasNonstd = '\x01';
    case 0x2d:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      if ('0' < *pcVar17) {
        bVar7 = 0;
        goto LAB_001bbc69;
      }
      uVar12 = uVar13 + 1;
      bVar6 = pcVar5[uVar12];
      uVar27 = (ulong)bVar6;
      if (*pcVar17 == '0') {
        if (((bVar6 | 0x20) == 0x78) &&
           (uVar26 = (ulong)(uVar13 + 2), (""[(byte)pcVar5[uVar26]] & 8) != 0)) {
          pParse->hasNonstd = '\x01';
          do {
            uVar12 = (int)uVar26 + 1;
            uVar26 = (ulong)uVar12;
          } while ((""[(byte)pcVar5[uVar26]] & 8) != 0);
LAB_001bb823:
          bVar6 = 1;
          goto LAB_001bb825;
        }
        if (0xfffffffffffffff5 < uVar27 - 0x3a) goto LAB_001bbd16;
      }
      else {
        if (uVar27 - 0x3a < 0xfffffffffffffff6) {
          bVar7 = 1;
          if (uVar27 == 0x2e) goto LAB_001bbc64;
          if ((bVar6 != 0x69) && (bVar6 != 0x49)) goto LAB_001bbaf2;
          pbVar23 = (byte *)(pcVar5 + uVar12);
          pbVar1 = pbVar23 + 3;
          lVar20 = 3;
          lVar24 = 0;
          pcVar19 = "inf";
          goto LAB_001bb795;
        }
        if (bVar6 == 0x30) {
          if (0xfffffffffffffff5 < (ulong)(byte)pcVar5[uVar13 + 2] - 0x3a) goto LAB_001bbd16;
          if (((byte)(pcVar5[uVar13 + 2] | 0x20U) == 0x78) &&
             (uVar27 = (ulong)(uVar13 + 3), (""[(byte)pcVar5[uVar27]] & 8) != 0)) {
            pParse->hasNonstd = '\x01';
            do {
              uVar12 = (int)uVar27 + 1;
              uVar27 = (ulong)uVar12;
            } while ((""[(byte)pcVar5[uVar27]] & 8) != 0);
            goto LAB_001bb823;
          }
        }
      }
      bVar7 = 0;
      goto LAB_001bbc69;
    case 0x2c:
      pParse->iErr = uVar13;
      return -4;
    case 0x2e:
      bVar7 = 3;
      if ((ulong)(byte)pcVar5[uVar13 + 1] - 0x3a < 0xfffffffffffffff6) goto LAB_001bbaf2;
      goto LAB_001bbc64;
    case 0x3a:
      pParse->iErr = uVar13;
      return -5;
    default:
      if (uVar12 != 0x5b) {
switchD_001bb171_caseD_1:
        lVar20 = 0;
        do {
          if ((bVar7 == (&aNanInfName[0].c1)[lVar20]) || (bVar7 == (&aNanInfName[0].c2)[lVar20])) {
            cVar21 = (&aNanInfName[0].n)[lVar20];
            iVar14 = sqlite3_strnicmp(pcVar17,*(char **)((long)&aNanInfName[0].zMatch + lVar20),
                                      (int)cVar21);
            if ((iVar14 == 0) &&
               (uVar12 = (int)cVar21 + uVar13, (""[(byte)pcVar5[uVar12]] & 6) == 0)) {
              if ((&aNanInfName[0].eType)[lVar20] == '\x05') {
                jsonBlobAppendNode(pParse,'\x05',5,"9e999");
              }
              else {
                uVar13 = pParse->nBlob;
                if (uVar13 < pParse->nBlobAlloc) {
                  pParse->nBlob = uVar13 + 1;
                  pParse->aBlob[uVar13] = '\0';
                }
                else {
                  jsonBlobExpandAndAppendOneByte(pParse,'\0');
                }
              }
              pParse->hasNonstd = '\x01';
              return uVar12;
            }
          }
          lVar20 = lVar20 + 0x18;
          if (lVar20 == 0x78) {
            pParse->iErr = uVar13;
            return -1;
          }
        } while( true );
      }
      uVar25 = pParse->nBlob;
      jsonBlobAppendNode(pParse,'\v',pParse->nJson - uVar13,(void *)0x0);
      if (pParse->oom != '\0') {
        return -1;
      }
      uVar4 = pParse->nBlob;
      uVar12 = *(int *)&pParse->iDepth + 1;
      pParse->iDepth = (u16)uVar12;
      if (1000 < (uVar12 & 0xffff)) {
        pParse->iErr = uVar13;
        return -1;
      }
      uVar18 = uVar13 + 1;
      uVar13 = jsonTranslateTextToBlob(pParse,uVar18);
      goto joined_r0x001bbd99;
    }
  } while( true );
LAB_001bb2da:
  iVar14 = (int)uVar15;
  uVar12 = iVar14 + 1;
  uVar15 = (ulong)uVar12;
  uVar13 = pParse->nBlob;
  uVar8 = jsonTranslateTextToBlob(pParse,uVar12);
  uVar27 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    if (uVar8 == 0xfffffffe) {
      uVar12 = pParse->iErr;
      iVar14 = 4;
      uVar27 = 0xfffffffe;
      if (pParse->nBlob != uVar4) {
        pParse->hasNonstd = '\x01';
      }
LAB_001bb450:
      bVar28 = false;
    }
    else {
      iVar11 = json5Whitespace(pcVar5 + uVar12);
      uVar12 = uVar12 + iVar11;
      uVar15 = (ulong)uVar12;
      uVar22 = '\a';
      if ((""[(byte)pcVar5[uVar15]] & 0x42) == 0) {
        if (pcVar5[uVar15] == 0x5c) {
          if (pcVar5[uVar12 + 1] == 'u') {
            iVar10 = jsonIs4Hex(pcVar5 + (ulong)(uVar12 + 1) + 1);
            bVar28 = iVar10 == 0;
            uVar22 = '\b' - bVar28;
          }
          else {
            bVar28 = true;
          }
          if (!bVar28) goto LAB_001bb35d;
        }
        iVar14 = 1;
        if (uVar8 != 0xffffffff) {
          pParse->iErr = uVar12;
        }
        goto LAB_001bb450;
      }
LAB_001bb35d:
      pcVar17 = pcVar5 + uVar15;
LAB_001bb37a:
      do {
        iVar10 = (int)uVar15;
        uVar8 = iVar10 + 1;
        uVar15 = (ulong)uVar8;
        bVar7 = pcVar5[(int)uVar8];
        if ((""[bVar7] & 0x46) != 0) {
          iVar9 = json5Whitespace(pcVar5 + (int)uVar8);
          if (iVar9 == 0) goto LAB_001bb37a;
        }
        if (bVar7 != 0x5c) break;
        bVar28 = true;
        if (pcVar5[iVar10 + 2] == 'u') {
          iVar9 = jsonIs4Hex(pcVar5 + (long)(iVar10 + 2) + 1);
          bVar28 = iVar9 == 0;
          if (!bVar28) {
            uVar22 = '\b';
          }
        }
        uVar15 = (ulong)(iVar10 + 1);
      } while (!bVar28);
      jsonBlobAppendNode(pParse,uVar22,iVar10 - (iVar11 + iVar14),pcVar17);
      pParse->hasNonstd = '\x01';
      uVar27 = (ulong)(iVar10 + 1);
      iVar14 = 0;
      bVar28 = true;
    }
    uVar15 = (ulong)uVar12;
    if (bVar28) goto LAB_001bb45c;
  }
  else {
LAB_001bb45c:
    uVar18 = (u32)uVar27;
    iVar14 = 1;
    if (pParse->oom == '\0') {
      if ((byte)((pParse->aBlob[uVar13] & 0xf) - 0xb) < 0xfc) {
LAB_001bb480:
        pParse->iErr = (u32)uVar15;
      }
      else {
        if ((ulong)(byte)pcVar5[uVar27] != 0x3a) {
          uVar15 = uVar27;
          if (""[(byte)pcVar5[uVar27]] != '\0') {
            do {
              uVar18 = (int)uVar27 + 1;
              uVar27 = (ulong)uVar18;
            } while (""[(byte)pcVar5[uVar27]] != '\0');
            uVar15 = uVar27;
            if (pcVar5[uVar27] == 0x3a) goto LAB_001bb4bc;
          }
          iVar11 = jsonTranslateTextToBlob(pParse,(u32)uVar15);
          if (iVar11 != -5) {
            if (iVar11 == -1) goto LAB_001bb526;
            goto LAB_001bb480;
          }
          uVar18 = pParse->iErr;
        }
LAB_001bb4bc:
        uVar13 = uVar18 + 1;
        uVar15 = (ulong)uVar13;
        uVar12 = jsonTranslateTextToBlob(pParse,uVar13);
        uVar27 = (ulong)uVar12;
        if ((int)uVar12 < 1) {
          if (uVar12 != 0xffffffff) {
            pParse->iErr = uVar13;
          }
LAB_001bb515:
          iVar14 = 1;
        }
        else {
          bVar7 = pcVar5[uVar27];
          if (bVar7 == 0x2c) {
LAB_001bb520:
            iVar14 = 6;
            uVar15 = uVar27;
          }
          else {
            if (bVar7 != 0x7d) {
              uVar15 = uVar27;
              if (""[bVar7] != '\0') {
                sVar16 = strspn(pcVar5 + uVar27 + 1,"\t\n\r ");
                uVar13 = uVar12 + (int)sVar16 + 1;
                uVar27 = (ulong)uVar13;
                if (pcVar5[uVar27] == ',') goto LAB_001bb520;
                if (pcVar5[uVar27] == '}') goto LAB_001bb4e2;
                uVar15 = (ulong)uVar13;
              }
              iVar14 = jsonTranslateTextToBlob(pParse,(u32)uVar15);
              if (iVar14 != -2) {
                if (iVar14 != -4) {
                  pParse->iErr = (u32)uVar15;
                  goto LAB_001bb515;
                }
                uVar27 = (ulong)pParse->iErr;
                goto LAB_001bb520;
              }
              uVar27 = (ulong)pParse->iErr;
            }
LAB_001bb4e2:
            iVar14 = 4;
            uVar15 = uVar27;
          }
        }
      }
    }
  }
LAB_001bb526:
  if (iVar14 != 6) {
    if (iVar14 != 4) {
      return -1;
    }
    jsonBlobChangePayloadSize(pParse,uVar25,pParse->nBlob - uVar4);
    pParse->iDepth = pParse->iDepth - 1;
    return (int)uVar15 + 1;
  }
  goto LAB_001bb2da;
joined_r0x001bbd99:
  if ((int)uVar13 < 1) {
    if (uVar13 == 0xffffffff) {
      return -1;
    }
    if (uVar13 != 0xfffffffd) {
      pParse->iErr = uVar18;
      return -1;
    }
    uVar13 = pParse->iErr;
    if (pParse->nBlob != uVar4) {
      pParse->hasNonstd = '\x01';
    }
LAB_001bbebb:
    jsonBlobChangePayloadSize(pParse,uVar25,pParse->nBlob - uVar4);
    pParse->iDepth = pParse->iDepth - 1;
    return uVar13 + 1;
  }
  bVar7 = pcVar5[uVar13];
  if (bVar7 != 0x2c) {
    if (bVar7 == 0x5d) goto LAB_001bbebb;
    if (""[bVar7] != '\0') {
      sVar16 = strspn(pcVar5 + (ulong)uVar13 + 1,"\t\n\r ");
      uVar13 = uVar13 + (int)sVar16 + 1;
      if (pcVar5[uVar13] == ',') goto LAB_001bbe06;
      if (pcVar5[uVar13] == ']') goto LAB_001bbebb;
    }
    iVar14 = jsonTranslateTextToBlob(pParse,uVar13);
    if (iVar14 != -4) {
      if (iVar14 != -3) {
        pParse->iErr = uVar13;
        return -1;
      }
      uVar13 = pParse->iErr;
      goto LAB_001bbebb;
    }
    uVar13 = pParse->iErr;
  }
LAB_001bbe06:
  uVar18 = uVar13 + 1;
  uVar13 = jsonTranslateTextToBlob(pParse,uVar18);
  goto joined_r0x001bbd99;
LAB_001bb884:
  uVar15 = (ulong)uVar12;
  cVar2 = ""[(byte)pcVar5[uVar15]];
  while (cVar2 != '\0') {
    iVar14 = (int)uVar15;
    uVar15 = (ulong)(iVar14 + 1);
    if ((""[(byte)pcVar5[uVar15]] == '\0') ||
       (uVar15 = (ulong)(iVar14 + 2), ""[(byte)pcVar5[uVar15]] == '\0')) break;
    uVar15 = (ulong)(iVar14 + 3);
    cVar2 = ""[(byte)pcVar5[uVar15]];
  }
  uVar25 = (u32)uVar15;
  cVar2 = pcVar5[uVar15];
  if (cVar2 == cVar21) {
    jsonBlobAppendNode(pParse,uVar22,~uVar13 + uVar25,pcVar5 + (uVar13 + 1));
    return uVar25 + 1;
  }
  if (cVar2 != '\\') {
    uVar12 = uVar25;
    if (cVar2 < ' ') {
      if (cVar2 == '\0') {
        pParse->iErr = uVar25;
        return -1;
      }
      pParse->hasNonstd = '\x01';
      uVar22 = '\t';
    }
    else if (cVar2 == '\"') {
      uVar22 = '\t';
    }
    goto LAB_001bba93;
  }
  uVar12 = uVar25 + 1;
  bVar7 = pcVar5[uVar12];
  if (bVar7 < 0x66) {
    if (bVar7 < 0x2f) {
      if (bVar7 < 0x22) {
        if (bVar7 != 10) goto LAB_001bba40;
      }
      else {
        if (bVar7 == 0x22) goto switchD_001bb948_caseD_6e;
LAB_001bba5d:
        if (bVar7 != 0x27) goto switchD_001bb948_caseD_6f;
      }
      goto switchD_001bb948_caseD_76;
    }
    if (bVar7 < 0x5c) {
      if (bVar7 != 0x2f) {
        if (bVar7 != 0x30) goto switchD_001bb948_caseD_6f;
        goto switchD_001bb948_caseD_76;
      }
    }
    else if ((bVar7 != 0x5c) && (bVar7 != 0x62)) goto switchD_001bb948_caseD_6f;
    goto switchD_001bb948_caseD_6e;
  }
  switch(bVar7) {
  case 0x6e:
  case 0x72:
  case 0x74:
    break;
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x77:
    goto switchD_001bb948_caseD_6f;
  case 0x75:
    iVar14 = jsonIs4Hex(pcVar5 + (uVar25 + 2));
    if (iVar14 == 0) {
      if (bVar7 < 0x30) {
        if (bVar7 != 10) {
          if (bVar7 != 0xd) goto LAB_001bba5d;
          goto LAB_001bba49;
        }
      }
      else {
        if (0x77 < bVar7) {
          if (bVar7 != 0x78) goto switchD_001bb948_caseD_6f;
          goto switchD_001bb948_caseD_78;
        }
        if ((bVar7 != 0x30) && (bVar7 != 0x76)) goto switchD_001bb948_caseD_6f;
      }
      goto switchD_001bb948_caseD_76;
    }
    break;
  case 0x76:
    goto switchD_001bb948_caseD_76;
  case 0x78:
switchD_001bb948_caseD_78:
    if (((""[(byte)pcVar5[uVar25 + 2]] & 8) == 0) ||
       ((""[(byte)pcVar5[(ulong)(uVar25 + 2) + 1]] & 8) == 0)) {
LAB_001bba40:
      if (bVar7 != 0xd) {
switchD_001bb948_caseD_6f:
        pParse->iErr = uVar12;
        return -1;
      }
LAB_001bba49:
      if (pcVar5[uVar25 + 2] == '\n') {
        uVar12 = uVar25 + 2;
      }
    }
    goto switchD_001bb948_caseD_76;
  default:
    if (bVar7 != 0x66) goto switchD_001bb948_caseD_6f;
  }
switchD_001bb948_caseD_6e:
  if (uVar22 == '\a') {
    uVar22 = '\b';
  }
LAB_001bba93:
  uVar12 = uVar12 + 1;
  goto LAB_001bb884;
switchD_001bb948_caseD_76:
  pParse->hasNonstd = '\x01';
  uVar22 = '\t';
  goto LAB_001bba93;
switchD_001bb171_caseD_b:
  iVar14 = json5Whitespace(pcVar17);
  if (iVar14 == 0) {
    pParse->iErr = uVar13;
    return -1;
  }
  pParse->hasNonstd = '\x01';
  uVar15 = (ulong)(iVar14 + uVar13);
  goto LAB_001bb148;
  while( true ) {
    if (""[*pbVar23] != ""[(byte)*pcVar19]) goto LAB_001bbbcb;
    pbVar23 = pbVar23 + 1;
    lVar24 = lVar24 + 1;
    pcVar19 = (char *)((byte *)pcVar19 + 1);
    lVar20 = lVar20 + -1;
    if (lVar20 == 0) break;
LAB_001bb795:
    if ((ulong)*pbVar23 == 0) {
      pcVar19 = "inf" + lVar24;
      goto LAB_001bbbcb;
    }
  }
  lVar20 = 0;
  pbVar23 = pbVar1;
  pcVar19 = (char *)(byte *)0x210e00;
LAB_001bbbcb:
  if (((int)lVar20 < 1) || (""[*pbVar23] == ""[(byte)*pcVar19])) {
    pParse->hasNonstd = '\x01';
    if (*pcVar17 == '-') {
      pcVar17 = "-9e999";
      uVar25 = 6;
    }
    else {
      pcVar17 = "9e999";
      uVar25 = 5;
    }
    jsonBlobAppendNode(pParse,'\x05',uVar25,pcVar17);
    iVar14 = sqlite3_strnicmp(pcVar5 + (uVar13 + 4),"inity",5);
    return uVar13 + (uint)(iVar14 == 0) * 5 + 4;
  }
  if (bVar6 == 0x2e) {
LAB_001bbc64:
    pParse->hasNonstd = '\x01';
LAB_001bbc69:
    bVar28 = true;
    do {
      bVar6 = bVar7;
      while( true ) {
        do {
          uVar27 = uVar15;
          iVar14 = (int)uVar27;
          uVar12 = iVar14 + 1;
          uVar15 = (ulong)uVar12;
          bVar3 = pcVar5[uVar15];
        } while (0xfffffffffffffff5 < (ulong)bVar3 - 0x3a);
        if (bVar3 != 0x2e) break;
        bVar3 = bVar6 & 2;
        bVar6 = bVar7 | 2;
        if (bVar3 != 0) goto LAB_001bbd4a;
      }
      cVar21 = pcVar5[uVar27];
      if ((bVar3 & 0xdf) != 0x45) {
        if (cVar21 < '0') {
          if (((cVar21 != '.') || (iVar14 - 1U < uVar13)) ||
             ((ulong)(byte)pcVar5[iVar14 - 1U] - 0x3a < 0xfffffffffffffff6)) {
LAB_001bbd4a:
            pParse->iErr = uVar12;
            return -1;
          }
          pParse->hasNonstd = '\x01';
          bVar6 = bVar6 | 1;
        }
LAB_001bb825:
        uVar13 = uVar13 + (*pcVar17 == '+');
        jsonBlobAppendNode(pParse,bVar6 + 3,uVar12 - uVar13,pcVar5 + uVar13);
        return uVar12;
      }
      if (cVar21 < '0') {
        if (((cVar21 != '.') || (iVar14 - 1U < uVar13)) ||
           ((ulong)(byte)pcVar5[iVar14 - 1U] - 0x3a < 0xfffffffffffffff6)) goto LAB_001bbd4a;
        pParse->hasNonstd = '\x01';
        bVar6 = bVar6 | 1;
      }
      if (!bVar28) goto LAB_001bbd4a;
      cVar21 = pcVar5[iVar14 + 2];
      if ((cVar21 == '-') || (cVar21 == '+')) {
        cVar21 = pcVar5[iVar14 + 3];
        uVar15 = (ulong)(iVar14 + 2);
      }
      uVar12 = (uint)uVar15;
      bVar7 = bVar6 | 2;
      bVar28 = false;
    } while (0xf5 < (byte)(cVar21 - 0x3aU));
LAB_001bbd16:
    pParse->iErr = uVar12;
  }
  else {
LAB_001bbaf2:
    pParse->iErr = uVar13;
  }
  return -1;
}

Assistant:

static int jsonTranslateTextToBlob(JsonParse *pParse, u32 i){
  char c;
  u32 j;
  u32 iThis, iStart;
  int x;
  u8 t;
  const char *z = pParse->zJson;
json_parse_restart:
  switch( (u8)z[i] ){
  case '{': {
    /* Parse object */
    iThis = pParse->nBlob;
    jsonBlobAppendNode(pParse, JSONB_OBJECT, pParse->nJson-i, 0);
    if( ++pParse->iDepth > JSON_MAX_DEPTH ){
      pParse->iErr = i;
      return -1;
    }
    iStart = pParse->nBlob;
    for(j=i+1;;j++){
      u32 iBlob = pParse->nBlob;
      x = jsonTranslateTextToBlob(pParse, j);
      if( x<=0 ){
        int op;
        if( x==(-2) ){
          j = pParse->iErr;
          if( pParse->nBlob!=(u32)iStart ) pParse->hasNonstd = 1;
          break;
        }
        j += json5Whitespace(&z[j]);
        op = JSONB_TEXT;
        if( sqlite3JsonId1(z[j])
         || (z[j]=='\\' && jsonIs4HexB(&z[j+1], &op))
        ){
          int k = j+1;
          while( (sqlite3JsonId2(z[k]) && json5Whitespace(&z[k])==0)
            || (z[k]=='\\' && jsonIs4HexB(&z[k+1], &op))
          ){
            k++;
          }
          assert( iBlob==pParse->nBlob );
          jsonBlobAppendNode(pParse, op, k-j, &z[j]);
          pParse->hasNonstd = 1;
          x = k;
        }else{
          if( x!=-1 ) pParse->iErr = j;
          return -1;
        }
      }
      if( pParse->oom ) return -1;
      t = pParse->aBlob[iBlob] & 0x0f;
      if( t<JSONB_TEXT || t>JSONB_TEXTRAW ){
        pParse->iErr = j;
        return -1;
      }
      j = x;
      if( z[j]==':' ){
        j++;
      }else{
        if( jsonIsspace(z[j]) ){
          /* strspn() is not helpful here */
          do{ j++; }while( jsonIsspace(z[j]) );
          if( z[j]==':' ){
            j++;
            goto parse_object_value;
          }
        }
        x = jsonTranslateTextToBlob(pParse, j);
        if( x!=(-5) ){
          if( x!=(-1) ) pParse->iErr = j;
          return -1;
        }
        j = pParse->iErr+1;
      }
    parse_object_value:
      x = jsonTranslateTextToBlob(pParse, j);
      if( x<=0 ){
        if( x!=(-1) ) pParse->iErr = j;
        return -1;
      }
      j = x;
      if( z[j]==',' ){
        continue;
      }else if( z[j]=='}' ){
        break;
      }else{
        if( jsonIsspace(z[j]) ){
          j += 1 + (u32)strspn(&z[j+1], jsonSpaces);
          if( z[j]==',' ){
            continue;
          }else if( z[j]=='}' ){
            break;
          }
        }
        x = jsonTranslateTextToBlob(pParse, j);
        if( x==(-4) ){
          j = pParse->iErr;
          continue;
        }
        if( x==(-2) ){
          j = pParse->iErr;
          break;
        }
      }
      pParse->iErr = j;
      return -1;
    }
    jsonBlobChangePayloadSize(pParse, iThis, pParse->nBlob - iStart);
    pParse->iDepth--;
    return j+1;
  }
  case '[': {
    /* Parse array */
    iThis = pParse->nBlob;
    assert( i<=(u32)pParse->nJson );
    jsonBlobAppendNode(pParse, JSONB_ARRAY, pParse->nJson - i, 0);
    iStart = pParse->nBlob;
    if( pParse->oom ) return -1;
    if( ++pParse->iDepth > JSON_MAX_DEPTH ){
      pParse->iErr = i;
      return -1;
    }
    for(j=i+1;;j++){
      x = jsonTranslateTextToBlob(pParse, j);
      if( x<=0 ){
        if( x==(-3) ){
          j = pParse->iErr;
          if( pParse->nBlob!=iStart ) pParse->hasNonstd = 1;
          break;
        }
        if( x!=(-1) ) pParse->iErr = j;
        return -1;
      }
      j = x;
      if( z[j]==',' ){
        continue;
      }else if( z[j]==']' ){
        break;
      }else{
        if( jsonIsspace(z[j]) ){
          j += 1 + (u32)strspn(&z[j+1], jsonSpaces);
          if( z[j]==',' ){
            continue;
          }else if( z[j]==']' ){
            break;
          }
        }
        x = jsonTranslateTextToBlob(pParse, j);
        if( x==(-4) ){
          j = pParse->iErr;
          continue;
        }
        if( x==(-3) ){
          j = pParse->iErr;
          break;
        }
      }
      pParse->iErr = j;
      return -1;
    }
    jsonBlobChangePayloadSize(pParse, iThis, pParse->nBlob - iStart);
    pParse->iDepth--;
    return j+1;
  }
  case '\'': {
    u8 opcode;
    char cDelim;
    pParse->hasNonstd = 1;
    opcode = JSONB_TEXT;
    goto parse_string;
  case '"':
    /* Parse string */
    opcode = JSONB_TEXT;
  parse_string:
    cDelim = z[i];
    j = i+1;
    while( 1 /*exit-by-break*/ ){
      if( jsonIsOk[(u8)z[j]] ){
        if( !jsonIsOk[(u8)z[j+1]] ){
          j += 1;
        }else if( !jsonIsOk[(u8)z[j+2]] ){
          j += 2;
        }else{
          j += 3;
          continue;
        }
      }
      c = z[j];
      if( c==cDelim ){
        break;
      }else if( c=='\\' ){
        c = z[++j];
        if( c=='"' || c=='\\' || c=='/' || c=='b' || c=='f'
           || c=='n' || c=='r' || c=='t'
           || (c=='u' && jsonIs4Hex(&z[j+1])) ){
          if( opcode==JSONB_TEXT ) opcode = JSONB_TEXTJ;
        }else if( c=='\'' || c=='0' || c=='v' || c=='\n'
           || (0xe2==(u8)c && 0x80==(u8)z[j+1]
                && (0xa8==(u8)z[j+2] || 0xa9==(u8)z[j+2]))
           || (c=='x' && jsonIs2Hex(&z[j+1])) ){
          opcode = JSONB_TEXT5;
          pParse->hasNonstd = 1;
        }else if( c=='\r' ){
          if( z[j+1]=='\n' ) j++;
          opcode = JSONB_TEXT5;
          pParse->hasNonstd = 1;
        }else{
          pParse->iErr = j;
          return -1;
        }
      }else if( c<=0x1f ){
        if( c==0 ){
          pParse->iErr = j;
          return -1;
        }
        /* Control characters are not allowed in canonical JSON string
        ** literals, but are allowed in JSON5 string literals. */
        opcode = JSONB_TEXT5;
        pParse->hasNonstd = 1;
      }else if( c=='"' ){
        opcode = JSONB_TEXT5;
      }
      j++;
    }
    jsonBlobAppendNode(pParse, opcode, j-1-i, &z[i+1]);
    return j+1;
  }
  case 't': {
    if( strncmp(z+i,"true",4)==0 && !sqlite3Isalnum(z[i+4]) ){
      jsonBlobAppendOneByte(pParse, JSONB_TRUE);
      return i+4;
    }
    pParse->iErr = i;
    return -1;
  }
  case 'f': {
    if( strncmp(z+i,"false",5)==0 && !sqlite3Isalnum(z[i+5]) ){
      jsonBlobAppendOneByte(pParse, JSONB_FALSE);
      return i+5;
    }
    pParse->iErr = i;
    return -1;
  }
  case '+': {
    u8 seenE;
    pParse->hasNonstd = 1;
    t = 0x00;            /* Bit 0x01:  JSON5.   Bit 0x02:  FLOAT */
    goto parse_number;
  case '.':
    if( sqlite3Isdigit(z[i+1]) ){
      pParse->hasNonstd = 1;
      t = 0x03;          /* Bit 0x01:  JSON5.   Bit 0x02:  FLOAT */
      seenE = 0;
      goto parse_number_2;
    }
    pParse->iErr = i;
    return -1;
  case '-':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    /* Parse number */
    t = 0x00;            /* Bit 0x01:  JSON5.   Bit 0x02:  FLOAT */
  parse_number:
    seenE = 0;
    assert( '-' < '0' );
    assert( '+' < '0' );
    assert( '.' < '0' );
    c = z[i];

    if( c<='0' ){
      if( c=='0' ){
        if( (z[i+1]=='x' || z[i+1]=='X') && sqlite3Isxdigit(z[i+2]) ){
          assert( t==0x00 );
          pParse->hasNonstd = 1;
          t = 0x01;
          for(j=i+3; sqlite3Isxdigit(z[j]); j++){}
          goto parse_number_finish;
        }else if( sqlite3Isdigit(z[i+1]) ){
          pParse->iErr = i+1;
          return -1;
        }
      }else{
        if( !sqlite3Isdigit(z[i+1]) ){
          /* JSON5 allows for "+Infinity" and "-Infinity" using exactly
          ** that case.  SQLite also allows these in any case and it allows
          ** "+inf" and "-inf". */
          if( (z[i+1]=='I' || z[i+1]=='i')
           && sqlite3StrNICmp(&z[i+1], "inf",3)==0
          ){
            pParse->hasNonstd = 1;
            if( z[i]=='-' ){
              jsonBlobAppendNode(pParse, JSONB_FLOAT, 6, "-9e999");
            }else{
              jsonBlobAppendNode(pParse, JSONB_FLOAT, 5, "9e999");
            }
            return i + (sqlite3StrNICmp(&z[i+4],"inity",5)==0 ? 9 : 4);
          }
          if( z[i+1]=='.' ){
            pParse->hasNonstd = 1;
            t |= 0x01;
            goto parse_number_2;
          }
          pParse->iErr = i;
          return -1;
        }
        if( z[i+1]=='0' ){
          if( sqlite3Isdigit(z[i+2]) ){
            pParse->iErr = i+1;
            return -1;
          }else if( (z[i+2]=='x' || z[i+2]=='X') && sqlite3Isxdigit(z[i+3]) ){
            pParse->hasNonstd = 1;
            t |= 0x01;
            for(j=i+4; sqlite3Isxdigit(z[j]); j++){}
            goto parse_number_finish;
          }
        }
      }
    }

  parse_number_2:
    for(j=i+1;; j++){
      c = z[j];
      if( sqlite3Isdigit(c) ) continue;
      if( c=='.' ){
        if( (t & 0x02)!=0 ){
          pParse->iErr = j;
          return -1;
        }
        t |= 0x02;
        continue;
      }
      if( c=='e' || c=='E' ){
        if( z[j-1]<'0' ){
          if( ALWAYS(z[j-1]=='.') && ALWAYS(j-2>=i) && sqlite3Isdigit(z[j-2]) ){
            pParse->hasNonstd = 1;
            t |= 0x01;
          }else{
            pParse->iErr = j;
            return -1;
          }
        }
        if( seenE ){
          pParse->iErr = j;
          return -1;
        }
        t |= 0x02;
        seenE = 1;
        c = z[j+1];
        if( c=='+' || c=='-' ){
          j++;
          c = z[j+1];
        }
        if( c<'0' || c>'9' ){
          pParse->iErr = j;
          return -1;
        }
        continue;
      }
      break;
    }
    if( z[j-1]<'0' ){
      if( ALWAYS(z[j-1]=='.') && ALWAYS(j-2>=i) && sqlite3Isdigit(z[j-2]) ){
        pParse->hasNonstd = 1;
        t |= 0x01;
      }else{
        pParse->iErr = j;
        return -1;
      }
    }
  parse_number_finish:
    assert( JSONB_INT+0x01==JSONB_INT5 );
    assert( JSONB_FLOAT+0x01==JSONB_FLOAT5 );
    assert( JSONB_INT+0x02==JSONB_FLOAT );
    if( z[i]=='+' ) i++;
    jsonBlobAppendNode(pParse, JSONB_INT+t, j-i, &z[i]);
    return j;
  }
  case '}': {
    pParse->iErr = i;
    return -2;  /* End of {...} */
  }
  case ']': {
    pParse->iErr = i;
    return -3;  /* End of [...] */
  }
  case ',': {
    pParse->iErr = i;
    return -4;  /* List separator */
  }
  case ':': {
    pParse->iErr = i;
    return -5;  /* Object label/value separator */
  }
  case 0: {
    return 0;   /* End of file */
  }
  case 0x09:
  case 0x0a:
  case 0x0d:
  case 0x20: {
    i += 1 + (u32)strspn(&z[i+1], jsonSpaces);
    goto json_parse_restart;
  }
  case 0x0b:
  case 0x0c:
  case '/':
  case 0xc2:
  case 0xe1:
  case 0xe2:
  case 0xe3:
  case 0xef: {
    j = json5Whitespace(&z[i]);
    if( j>0 ){
      i += j;
      pParse->hasNonstd = 1;
      goto json_parse_restart;
    }
    pParse->iErr = i;
    return -1;
  }
  case 'n': {
    if( strncmp(z+i,"null",4)==0 && !sqlite3Isalnum(z[i+4]) ){
      jsonBlobAppendOneByte(pParse, JSONB_NULL);
      return i+4;
    }
    /* fall-through into the default case that checks for NaN */
    /* no break */ deliberate_fall_through
  }
  default: {
    u32 k;
    int nn;
    c = z[i];
    for(k=0; k<sizeof(aNanInfName)/sizeof(aNanInfName[0]); k++){
      if( c!=aNanInfName[k].c1 && c!=aNanInfName[k].c2 ) continue;
      nn = aNanInfName[k].n;
      if( sqlite3StrNICmp(&z[i], aNanInfName[k].zMatch, nn)!=0 ){
        continue;
      }
      if( sqlite3Isalnum(z[i+nn]) ) continue;
      if( aNanInfName[k].eType==JSONB_FLOAT ){
        jsonBlobAppendNode(pParse, JSONB_FLOAT, 5, "9e999");
      }else{
        jsonBlobAppendOneByte(pParse, JSONB_NULL);
      }
      pParse->hasNonstd = 1;
      return i + nn;
    }
    pParse->iErr = i;
    return -1;  /* Syntax error */
  }
  } /* End switch(z[i]) */
}